

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-face.c
# Opt level: O0

void ndn_unix_face_accept(void *self,size_t param_len,void *param)

{
  int sock;
  ndn_unix_face_t *pnVar1;
  int *piVar2;
  ndn_msg *pnVar3;
  int ret;
  ndn_unix_face_t *ptr;
  void *param_local;
  size_t param_len_local;
  void *self_local;
  
  *(undefined8 *)((long)self + 0x98) = 0;
  sock = accept(*(int *)((long)self + 0xa0),(sockaddr *)0x0,(socklen_t *)0x0);
  if (sock < 0) {
    if ((sock != -1) || (piVar2 = __errno_location(), *piVar2 != 0xb)) {
      ndn_face_down((ndn_face_intf_t *)self);
      return;
    }
  }
  else {
    pnVar1 = ndn_unix_slave_face_construct(sock);
    if (pnVar1 == (ndn_unix_face_t *)0x0) {
      close(sock);
    }
  }
  pnVar3 = ndn_msgqueue_post(self,ndn_unix_face_accept,param_len,param);
  *(ndn_msg **)((long)self + 0x98) = pnVar3;
  return;
}

Assistant:

static void
ndn_unix_face_accept(void *self, size_t param_len, void *param){
  ndn_unix_face_t* ptr = (ndn_unix_face_t*)self;
  int ret = 0;

  ptr->process_event = NULL;

  ret = accept(ptr->sock, NULL, NULL);
  if(ret >= 0){
    //printf("New face created %d\n", ret);
    if(ndn_unix_slave_face_construct(ret) == NULL){
      close(ret);
    }
  }else if(ret == -1 && errno == EWOULDBLOCK){
    //No more connections
  }else{
    ndn_face_down(&ptr->intf);
    return;
  }

  ptr->process_event = ndn_msgqueue_post(self, ndn_unix_face_accept, param_len, param);
}